

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::String,kj::StringPtr&>(char *target,String *first,StringPtr *rest)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (first->content).ptr;
  sVar1 = (first->content).size_;
  pcVar3 = pcVar2 + (sVar1 - 1);
  if (sVar1 == 0) {
    pcVar2 = (char *)0x0;
    pcVar3 = (char *)0x0;
  }
  for (; pcVar2 != pcVar3; pcVar2 = pcVar2 + 1) {
    *target = *pcVar2;
    target = target + 1;
  }
  pcVar3 = fill<kj::StringPtr>(target,rest);
  return pcVar3;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}